

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_118044::BuildFileImpl::parseRootNode(BuildFileImpl *this,Node *node)

{
  uint uVar1;
  Command *pCVar2;
  StringRef message;
  StringRef Key;
  StringRef Key_00;
  StringRef message_00;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef message_01;
  StringRef name_03;
  StringRef name_04;
  StringRef Key_01;
  StringRef Key_02;
  iterator iVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  type tVar7;
  char cVar8;
  int iVar9;
  KeyValueNode *pKVar10;
  BuildFileImpl *pBVar11;
  Node *pNVar12;
  MappingNode *pMVar13;
  Tool *pTVar14;
  SequenceNode *pSVar15;
  Node *pNVar16;
  __uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  *this_00;
  iterator iVar17;
  Node *pNVar18;
  size_type sVar19;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  *puVar20;
  size_t in_RCX;
  ScalarNode *scalar;
  ScalarNode *scalar_00;
  ScalarNode *scalar_01;
  ScalarNode *scalar_02;
  ScalarNode *scalar_03;
  ScalarNode *scalar_04;
  ScalarNode *scalar_05;
  char *pcVar21;
  ScalarNode *scalar_06;
  ScalarNode *scalar_07;
  ScalarNode *scalar_08;
  ScalarNode *scalar_09;
  ScalarNode *scalar_10;
  ScalarNode *scalar_11;
  ScalarNode *scalar_12;
  ScalarNode *scalar_13;
  ScalarNode *scalar_14;
  ScalarNode *scalar_15;
  ScalarNode *scalar_16;
  ScalarNode *scalar_17;
  ScalarNode *scalar_19;
  ScalarNode *scalar_20;
  ScalarNode *scalar_21;
  SequenceNode *__range6;
  vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>> *this_01;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  SVar22;
  StringRef name_05;
  StringRef message_02;
  StringRef message_03;
  StringRef name_06;
  StringRef message_04;
  StringRef message_05;
  StringRef message_06;
  StringRef message_07;
  StringRef message_08;
  StringRef name_07;
  StringRef message_09;
  StringRef message_10;
  StringRef name_08;
  StringRef message_11;
  StringRef name_09;
  StringRef message_12;
  StringRef message_13;
  StringRef message_14;
  StringRef message_15;
  StringRef name_10;
  StringRef message_16;
  StringRef message_17;
  StringRef message_18;
  StringRef name_11;
  StringRef name_12;
  StringRef message_19;
  StringRef name_13;
  StringRef message_20;
  StringRef message_21;
  StringRef name_14;
  StringRef message_22;
  StringRef message_23;
  StringRef message_24;
  StringRef message_25;
  StringRef message_26;
  StringRef message_27;
  StringRef message_28;
  StringRef message_29;
  StringRef name_15;
  MappingNode *pMStack_150;
  iterator it;
  iterator __begin5;
  iterator __begin3;
  uint32_t version;
  string name_2;
  string key;
  string value;
  property_list_type properties;
  string name;
  iterator __begin2;
  iterator __begin8;
  ScalarNode *scalar_18;
  
  if (node->TypeID != 4) {
    pcVar21 = "unexpected top-level node";
    pMStack_150 = (MappingNode *)0x19;
    goto LAB_0013069c;
  }
  it = llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)node);
  pKVar10 = llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator->(&it);
  pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10);
  name_05.Length = in_RCX;
  name_05.Data = (char *)0x6;
  bVar6 = nodeIsScalarString(pBVar11,(Node *)0x1a7259,name_05);
  pKVar10 = llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator->(&it);
  if (!bVar6) {
    node = llvm::yaml::KeyValueNode::getKey(pKVar10);
    pcVar21 = "expected initial mapping key \'client\'";
    pMStack_150 = (MappingNode *)0x25;
    goto LAB_0013069c;
  }
  pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
  uVar1 = pNVar12->TypeID;
  pKVar10 = llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator->(&it);
  node = llvm::yaml::KeyValueNode::getValue(pKVar10);
  if (uVar1 != 4) {
    pcVar21 = "unexpected \'client\' value (expected map)";
    pMStack_150 = (MappingNode *)0x28;
    goto LAB_0013069c;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  _version = _version & 0xffffffff00000000;
  name.field_2._M_local_buf[0] = '\0';
  properties.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  properties.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  properties.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __begin2 = llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)node);
  while (__begin2.Base != (MappingNode *)0x0) {
    pKVar10 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator*(&__begin2);
    pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
    if (pNVar12->TypeID != 1) {
      node = llvm::yaml::KeyValueNode::getKey(pKVar10);
      pcVar21 = "invalid key type in \'client\' map";
      pMStack_150 = (MappingNode *)0x20;
      goto LAB_00130d53;
    }
    pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
    if (pNVar12->TypeID != 1) {
      node = llvm::yaml::KeyValueNode::getValue(pKVar10);
      pcVar21 = "invalid value type in \'client\' map";
      pMStack_150 = (MappingNode *)0x22;
      goto LAB_00130d53;
    }
    pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_(&key,pNVar12,scalar);
    pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_(&value,pNVar12,scalar_00);
    bVar6 = std::operator==(&key,"name");
    if (bVar6) {
      std::__cxx11::string::_M_assign((string *)&name);
    }
    else {
      bVar6 = std::operator==(&key,"version");
      if (bVar6) {
        name_2._M_dataplus = value._M_dataplus;
        name_2._M_string_length = value._M_string_length;
        tVar7 = llvm::StringRef::getAsInteger<unsigned_int>((StringRef *)&name_2,10,&version);
        if (tVar7) {
          pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
          message_02.Length = 0x26;
          message_02.Data = "invalid version number in \'client\' map";
          error(this,pNVar12,message_02);
        }
      }
    }
    bVar6 = std::operator==(&key,"perform-ownership-analysis");
    if (bVar6) {
      bVar6 = std::operator==(&value,"yes");
      if (bVar6) {
        this->performOwnershipAnalysis = true;
      }
    }
    else {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&name_2,&key,&value);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&properties,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&name_2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&name_2);
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
    operator++(&__begin2);
  }
  name_2._M_dataplus._M_p = (pointer)this->delegate;
  name_2.field_2._8_8_ = (((MappingNode *)node)->super_Node).SourceRange.Start.Ptr;
  name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p;
  name_2.field_2._M_allocated_capacity = (this->mainFilename)._M_string_length;
  pMStack_150 = (MappingNode *)name._M_string_length;
  iVar9 = (*((BuildFileDelegate *)name_2._M_dataplus._M_p)->_vptr_BuildFileDelegate[7])
                    (name_2._M_dataplus._M_p,&name_2,name._M_dataplus._M_p,name._M_string_length,
                     (ulong)_version & 0xffffffff,&properties);
  if ((char)iVar9 == '\0') {
    pcVar21 = "unable to configure client";
    pMStack_150 = (MappingNode *)0x1a;
LAB_00130d53:
    message_08.Length = (size_t)pMStack_150;
    message_08.Data = pcVar21;
    error(this,node,message_08);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&properties);
    goto LAB_00130d65;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&properties);
  std::__cxx11::string::_M_dispose();
  llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
  operator++(&it);
  if (it.Base == (MappingNode *)0x0) {
    return true;
  }
  pKVar10 = llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator->(&it);
  pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10);
  name_06.Length = (size_t)pMStack_150;
  name_06.Data = (char *)0x5;
  bVar6 = nodeIsScalarString(pBVar11,(Node *)"tools",name_06);
  if (bVar6) {
    pKVar10 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator->(&it);
    pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
    uVar1 = pNVar12->TypeID;
    pKVar10 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator->(&it);
    node = llvm::yaml::KeyValueNode::getValue(pKVar10);
    if (uVar1 == 4) {
      _version = llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)node);
      pMStack_150 = (MappingNode *)&version;
      while (_version != (MappingNode *)0x0) {
        pKVar10 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator*((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                             *)&version);
        pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
        if (pNVar12->TypeID == 1) {
          pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
          if (pNVar12->TypeID != 4) {
            pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
            pcVar21 = "invalid value type in \'tools\' map";
            pMStack_150 = (MappingNode *)0x21;
            goto LAB_00130cec;
          }
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                    (&name,pNVar12,scalar_01);
          pMVar13 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar10);
          sVar5 = name._M_string_length;
          _Var4 = name._M_dataplus;
          pMStack_150 = (MappingNode *)llvm::yaml::KeyValueNode::getKey(pKVar10);
          name_15.Length = sVar5;
          name_15.Data = _Var4._M_p;
          pTVar14 = getOrCreateTool(this,name_15,(Node *)pMStack_150);
          if (pTVar14 == (Tool *)0x0) goto LAB_00130d65;
          __begin3 = llvm::yaml::begin<llvm::yaml::MappingNode>(pMVar13);
          while (__begin3.Base != (MappingNode *)0x0) {
            pKVar10 = llvm::yaml::
                      basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                      operator*(&__begin3);
            pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
            pSVar15 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar10);
            if (pNVar12->TypeID == 1) {
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        (&key,pNVar12,scalar_02);
              pMStack_150 = (MappingNode *)key._M_string_length;
              _Var4 = key._M_dataplus;
              uVar1 = (pSVar15->super_Node).TypeID;
              if (uVar1 == 1) {
                name_2.field_2._8_8_ = (pNVar12->SourceRange).Start.Ptr;
                name_2._M_dataplus._M_p = (pointer)this->delegate;
                name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p;
                name_2.field_2._M_allocated_capacity = (this->mainFilename)._M_string_length;
                (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                          (&value,pSVar15,(ScalarNode *)name_2.field_2._M_allocated_capacity);
                iVar9 = (*pTVar14->_vptr_Tool[2])
                                  (pTVar14,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&name_2,_Var4._M_p,pMStack_150,value._M_dataplus._M_p,
                                   value._M_string_length);
                cVar8 = (char)iVar9;
                std::__cxx11::string::_M_dispose();
LAB_00130c96:
                if (cVar8 == '\0') goto LAB_001316eb;
              }
              else {
                if (uVar1 == 5) {
                  value._M_dataplus._M_p = (pointer)0x0;
                  value._M_string_length = 0;
                  value.field_2._M_allocated_capacity = 0;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)llvm::yaml::begin<llvm::yaml::SequenceNode>(pSVar15);
                  while (pMStack_150 = (MappingNode *)key._M_string_length,
                        _Var4._M_p = key._M_dataplus._M_p,
                        properties.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    pNVar16 = llvm::yaml::
                              basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                              ::operator*((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                           *)&properties);
                    if (pNVar16->TypeID == 1) {
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&name_2,pNVar16,scalar_05);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&value,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&name_2);
                      std::__cxx11::string::_M_dispose();
                    }
                    else {
                      message_05.Length = 0x2a;
                      message_05.Data = "invalid value type for tool in \'tools\' map";
                      error(this,pNVar16,message_05);
                    }
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                    operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                *)&properties);
                  }
                  name_2.field_2._8_8_ = (pNVar12->SourceRange).Start.Ptr;
                  name_2._M_dataplus._M_p = (pointer)this->delegate;
                  name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p;
                  name_2.field_2._M_allocated_capacity = (this->mainFilename)._M_string_length;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&properties,
                             value._M_dataplus._M_p,value._M_string_length);
                  iVar9 = (*pTVar14->_vptr_Tool[3])
                                    (pTVar14,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&name_2,_Var4._M_p,pMStack_150,
                                     properties.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (long)properties.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)properties.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4);
                  cVar8 = (char)iVar9;
                  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
                  ~_Vector_base((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                                &properties);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&value);
                  goto LAB_00130c96;
                }
                if (uVar1 == 4) {
                  __begin2.Base = (MappingNode *)0x0;
                  __begin5 = llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)pSVar15);
                  while (pMStack_150 = (MappingNode *)key._M_string_length,
                        _Var4._M_p = key._M_dataplus._M_p, __begin5.Base != (MappingNode *)0x0) {
                    pKVar10 = llvm::yaml::
                              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                              ::operator*(&__begin5);
                    pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                    if (pNVar16->TypeID == 1) {
                      pNVar16 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                      if (pNVar16->TypeID != 1) {
                        pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                        pcVar21 = "invalid value type for \'";
                        goto LAB_001309c3;
                      }
                      pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&value,pNVar16,scalar_03);
                      pNVar16 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)&properties,pNVar16,scalar_04);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&name_2,&value,(string *)&properties);
                      std::
                      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                  *)&__begin2,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&name_2);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&name_2);
                    }
                    else {
                      pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                      pcVar21 = "invalid key type for \'";
LAB_001309c3:
                      std::operator+(&value,pcVar21,&key);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&name_2,&value,"\' in \'tools\' map");
                      message.Length = name_2._M_string_length;
                      message.Data = name_2._M_dataplus._M_p;
                      error(this,pNVar16,message);
                    }
                    std::__cxx11::string::_M_dispose();
                    std::__cxx11::string::_M_dispose();
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator++(&__begin5);
                  }
                  name_2.field_2._8_8_ = (pNVar12->SourceRange).Start.Ptr;
                  name_2._M_dataplus._M_p = (pointer)this->delegate;
                  name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p;
                  name_2.field_2._M_allocated_capacity = (this->mainFilename)._M_string_length;
                  value._M_dataplus._M_p = (pointer)0x0;
                  value._M_string_length = 0;
                  value.field_2._M_allocated_capacity = 0;
                  std::
                  vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                  ::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                            ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                              *)&value,__begin2.Base,0);
                  iVar9 = (*pTVar14->_vptr_Tool[4])
                                    (pTVar14,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&name_2,_Var4._M_p,pMStack_150,
                                     value._M_dataplus._M_p,
                                     (long)(value._M_string_length - (long)value._M_dataplus._M_p)
                                     >> 5);
                  cVar8 = (char)iVar9;
                  std::
                  _Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                  ::~_Vector_base((_Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                                   *)&value);
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&__begin2);
                  goto LAB_00130c96;
                }
                pMStack_150 = (MappingNode *)0x2a;
                message_06.Length = 0x2a;
                message_06.Data = "invalid value type for tool in \'tools\' map";
                error(this,(Node *)pSVar15,message_06);
              }
              std::__cxx11::string::_M_dispose();
            }
            else {
              pMStack_150 = (MappingNode *)0x28;
              message_04.Length = 0x28;
              message_04.Data = "invalid key type for tool in \'tools\' map";
              error(this,pNVar12,message_04);
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&__begin3);
          }
          std::__cxx11::string::_M_dispose();
        }
        else {
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          pcVar21 = "invalid key type in \'tools\' map";
          pMStack_150 = (MappingNode *)0x1f;
LAB_00130cec:
          message_07.Length = (size_t)pMStack_150;
          message_07.Data = pcVar21;
          error(this,pNVar12,message_07);
        }
        llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
        operator++((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> *)
                   &version);
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&it);
      goto LAB_00130d92;
    }
    pcVar21 = "unexpected \'tools\' value (expected map)";
LAB_00130d7e:
    pMStack_150 = (MappingNode *)0x27;
  }
  else {
LAB_00130d92:
    if (it.Base == (MappingNode *)0x0) {
      return true;
    }
    pKVar10 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator->(&it);
    pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10);
    name_07.Length = (size_t)pMStack_150;
    name_07.Data = (char *)0x7;
    bVar6 = nodeIsScalarString(pBVar11,(Node *)0x1a7448,name_07);
    if (bVar6) {
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
      uVar1 = pNVar12->TypeID;
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      node = llvm::yaml::KeyValueNode::getValue(pKVar10);
      if (uVar1 != 4) {
        pcVar21 = "unexpected \'targets\' value (expected map)";
        pMStack_150 = (MappingNode *)0x29;
        goto LAB_0013069c;
      }
      key._M_dataplus._M_p =
           (pointer)llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)node);
      pMStack_150 = (MappingNode *)&this->targets;
      while (key._M_dataplus._M_p != (pointer)0x0) {
        pKVar10 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator*((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                             *)&key);
        pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
        if (pNVar12->TypeID == 1) {
          pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
          if (pNVar12->TypeID != 5) {
            pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
            pcVar21 = "invalid value type in \'targets\' map";
            pMStack_150 = (MappingNode *)0x23;
            goto LAB_00130f84;
          }
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                    (&name_2,pNVar12,scalar_06);
          pSVar15 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar10);
          llvm::make_unique<llbuild::buildsystem::Target,std::__cxx11::string&>
                    ((llvm *)&value,&name_2);
          properties.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)llvm::yaml::begin<llvm::yaml::SequenceNode>(pSVar15);
          while (properties.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            pNVar12 = llvm::yaml::
                      basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                      operator*((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                 *)&properties);
            if (pNVar12->TypeID == 1) {
              this_01 = (vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                         *)(value._M_dataplus._M_p + 0x20);
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        (&name,pNVar12,scalar_07);
              name_03.Length = name._M_string_length;
              name_03.Data = name._M_dataplus._M_p;
              __begin2.Base = (MappingNode *)getOrCreateNode(this,name_03,true);
              std::vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>::
              emplace_back<llbuild::buildsystem::Node*>(this_01,(Node **)&__begin2);
              std::__cxx11::string::_M_dispose();
            }
            else {
              message_09.Length = 0x22;
              message_09.Data = "invalid node type in \'targets\' map";
              error(this,pNVar12,message_09);
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
            operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *)
                       &properties);
          }
          pMStack_150 = (MappingNode *)value._M_dataplus._M_p;
          (*this->delegate->_vptr_BuildFileDelegate[9])
                    (this->delegate,name_2._M_dataplus._M_p,name_2._M_string_length);
          Key.Length = name_2._M_string_length;
          Key.Data = name_2._M_dataplus._M_p;
          this_00 = (__uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                     *)llvm::
                       StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                       ::operator[](&this->targets,Key);
          _Var4 = value._M_dataplus;
          value._M_dataplus._M_p = (pointer)0x0;
          std::
          __uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
          ::reset(this_00,(pointer)_Var4._M_p);
          std::
          unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
          ::~unique_ptr((unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                         *)&value);
          std::__cxx11::string::_M_dispose();
        }
        else {
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          pcVar21 = "invalid key type in \'targets\' map";
          pMStack_150 = (MappingNode *)0x21;
LAB_00130f84:
          message_10.Length = (size_t)pMStack_150;
          message_10.Data = pcVar21;
          error(this,pNVar12,message_10);
        }
        llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
        operator++((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> *)
                   &key);
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&it);
    }
    if (it.Base == (MappingNode *)0x0) {
      return true;
    }
    pKVar10 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator->(&it);
    pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10);
    name_08.Length = (size_t)pMStack_150;
    name_08.Data = (char *)0x7;
    bVar6 = nodeIsScalarString(pBVar11,(Node *)"default",name_08);
    if (bVar6) {
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
      uVar1 = pNVar12->TypeID;
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      node = llvm::yaml::KeyValueNode::getValue(pKVar10);
      if (uVar1 != 1) {
        pcVar21 = "unexpected \'default\' target value (expected scalar)";
        pMStack_150 = (MappingNode *)0x33;
        goto LAB_0013069c;
      }
      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_(&name_2,node,scalar_08);
      Key_00.Length = name_2._M_string_length;
      Key_00.Data = name_2._M_dataplus._M_p;
      iVar17 = llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
               ::find(&this->targets,Key_00);
      SVar22.Ptr = (this->targets).super_StringMapImpl.TheTable +
                   (this->targets).super_StringMapImpl.NumBuckets;
      if (iVar17.
          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
          .Ptr == (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
                   )SVar22.Ptr) {
        pMStack_150 = (MappingNode *)0x3d;
        message_11.Length = 0x3d;
        message_11.Data = "invalid default target, a default target should be in targets";
        error(this,node,message_11);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this->defaultTarget);
        (*this->delegate->_vptr_BuildFileDelegate[10])
                  (this->delegate,(this->defaultTarget)._M_dataplus._M_p,
                   (this->defaultTarget)._M_string_length);
      }
      std::__cxx11::string::_M_dispose();
      if (iVar17.
          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
          .Ptr == (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
                   )SVar22.Ptr) {
        return false;
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&it);
    }
    if (it.Base == (MappingNode *)0x0) {
      return true;
    }
    pKVar10 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator->(&it);
    pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10);
    name_09.Length = (size_t)pMStack_150;
    name_09.Data = (char *)0x5;
    bVar6 = nodeIsScalarString(pBVar11,(Node *)"nodes",name_09);
    if (bVar6) {
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
      uVar1 = pNVar12->TypeID;
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      node = llvm::yaml::KeyValueNode::getValue(pKVar10);
      if (uVar1 != 4) {
        pcVar21 = "unexpected \'nodes\' value (expected map)";
        goto LAB_00130d7e;
      }
      _version = llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)node);
      pMStack_150 = (MappingNode *)&version;
      while (_version != (MappingNode *)0x0) {
        pKVar10 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator*((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                             *)&version);
        pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
        if (pNVar12->TypeID == 1) {
          pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
          if (pNVar12->TypeID != 4) {
            pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
            pcVar21 = "invalid value type in \'nodes\' map";
            pMStack_150 = (MappingNode *)0x21;
            goto LAB_001316c2;
          }
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                    (&name,pNVar12,scalar_09);
          pMVar13 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar10);
          name_04.Length = name._M_string_length;
          name_04.Data = name._M_dataplus._M_p;
          pMStack_150 = (MappingNode *)0x0;
          pNVar18 = getOrCreateNode(this,name_04,false);
          __begin3 = llvm::yaml::begin<llvm::yaml::MappingNode>(pMVar13);
          while (__begin3.Base != (MappingNode *)0x0) {
            pKVar10 = llvm::yaml::
                      basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                      operator*(&__begin3);
            pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
            pSVar15 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar10);
            if (pNVar12->TypeID == 1) {
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        (&key,pNVar12,scalar_10);
              pMStack_150 = (MappingNode *)key._M_string_length;
              _Var4 = key._M_dataplus;
              uVar1 = (pSVar15->super_Node).TypeID;
              if (uVar1 == 1) {
                name_2.field_2._8_8_ = (pNVar12->SourceRange).Start.Ptr;
                name_2._M_dataplus._M_p = (pointer)this->delegate;
                name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p;
                name_2.field_2._M_allocated_capacity = (this->mainFilename)._M_string_length;
                (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                          (&value,pSVar15,(ScalarNode *)name_2.field_2._M_allocated_capacity);
                iVar9 = (*pNVar18->_vptr_Node[2])
                                  (pNVar18,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&name_2,_Var4._M_p,pMStack_150,value._M_dataplus._M_p,
                                   value._M_string_length);
                cVar8 = (char)iVar9;
                std::__cxx11::string::_M_dispose();
LAB_0013166b:
                if (cVar8 == '\0') goto LAB_001316eb;
              }
              else {
                if (uVar1 == 5) {
                  value._M_dataplus._M_p = (pointer)0x0;
                  value._M_string_length = 0;
                  value.field_2._M_allocated_capacity = 0;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)llvm::yaml::begin<llvm::yaml::SequenceNode>(pSVar15);
                  while (pMStack_150 = (MappingNode *)key._M_string_length,
                        _Var4._M_p = key._M_dataplus._M_p,
                        properties.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    pNVar16 = llvm::yaml::
                              basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                              ::operator*((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                           *)&properties);
                    if (pNVar16->TypeID == 1) {
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&name_2,pNVar16,scalar_13);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&value,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&name_2);
                      std::__cxx11::string::_M_dispose();
                    }
                    else {
                      message_13.Length = 0x2a;
                      message_13.Data = "invalid value type for node in \'nodes\' map";
                      error(this,pNVar16,message_13);
                    }
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                    operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                *)&properties);
                  }
                  name_2.field_2._8_8_ = (pNVar12->SourceRange).Start.Ptr;
                  name_2._M_dataplus._M_p = (pointer)this->delegate;
                  name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p;
                  name_2.field_2._M_allocated_capacity = (this->mainFilename)._M_string_length;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  properties.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&properties,
                             value._M_dataplus._M_p,value._M_string_length);
                  iVar9 = (*pNVar18->_vptr_Node[3])
                                    (pNVar18,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&name_2,_Var4._M_p,pMStack_150,
                                     properties.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (long)properties.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)properties.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4);
                  cVar8 = (char)iVar9;
                  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
                  ~_Vector_base((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                                &properties);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&value);
                  goto LAB_0013166b;
                }
                if (uVar1 == 4) {
                  __begin2.Base = (MappingNode *)0x0;
                  __begin5 = llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)pSVar15);
                  while (pMStack_150 = (MappingNode *)key._M_string_length,
                        _Var4._M_p = key._M_dataplus._M_p, __begin5.Base != (MappingNode *)0x0) {
                    pKVar10 = llvm::yaml::
                              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                              ::operator*(&__begin5);
                    pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                    if (pNVar16->TypeID == 1) {
                      pNVar16 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                      if (pNVar16->TypeID != 1) {
                        pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                        pcVar21 = "invalid value type for \'";
                        goto LAB_0013138a;
                      }
                      pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&value,pNVar16,scalar_11);
                      pNVar16 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)&properties,pNVar16,scalar_12);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&name_2,&value,(string *)&properties);
                      std::
                      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                  *)&__begin2,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&name_2);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&name_2);
                    }
                    else {
                      pNVar16 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                      pcVar21 = "invalid key type for \'";
LAB_0013138a:
                      std::operator+(&value,pcVar21,&key);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&name_2,&value,"\' in \'nodes\' map");
                      message_00.Length = name_2._M_string_length;
                      message_00.Data = name_2._M_dataplus._M_p;
                      error(this,pNVar16,message_00);
                    }
                    std::__cxx11::string::_M_dispose();
                    std::__cxx11::string::_M_dispose();
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator++(&__begin5);
                  }
                  name_2.field_2._8_8_ = (pNVar12->SourceRange).Start.Ptr;
                  name_2._M_dataplus._M_p = (pointer)this->delegate;
                  name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p;
                  name_2.field_2._M_allocated_capacity = (this->mainFilename)._M_string_length;
                  value._M_dataplus._M_p = (pointer)0x0;
                  value._M_string_length = 0;
                  value.field_2._M_allocated_capacity = 0;
                  std::
                  vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                  ::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                            ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                              *)&value,__begin2.Base,0);
                  iVar9 = (*pNVar18->_vptr_Node[4])
                                    (pNVar18,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&name_2,_Var4._M_p,pMStack_150,
                                     value._M_dataplus._M_p,
                                     (long)(value._M_string_length - (long)value._M_dataplus._M_p)
                                     >> 5);
                  cVar8 = (char)iVar9;
                  std::
                  _Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                  ::~_Vector_base((_Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                                   *)&value);
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&__begin2);
                  goto LAB_0013166b;
                }
                pMStack_150 = (MappingNode *)0x2a;
                message_14.Length = 0x2a;
                message_14.Data = "invalid value type for node in \'nodes\' map";
                error(this,(Node *)pSVar15,message_14);
              }
              std::__cxx11::string::_M_dispose();
            }
            else {
              pMStack_150 = (MappingNode *)0x28;
              message_12.Length = 0x28;
              message_12.Data = "invalid key type for node in \'nodes\' map";
              error(this,pNVar12,message_12);
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&__begin3);
          }
          std::__cxx11::string::_M_dispose();
        }
        else {
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          pcVar21 = "invalid key type in \'nodes\' map";
          pMStack_150 = (MappingNode *)0x1f;
LAB_001316c2:
          message_15.Length = (size_t)pMStack_150;
          message_15.Data = pcVar21;
          error(this,pNVar12,message_15);
        }
        llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
        operator++((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> *)
                   &version);
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&it);
    }
    if (it.Base == (MappingNode *)0x0) {
      return true;
    }
    pKVar10 = llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator->(&it);
    pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10);
    name_10.Length = (size_t)pMStack_150;
    name_10.Data = (char *)0x8;
    bVar6 = nodeIsScalarString(pBVar11,(Node *)0x1a41d1,name_10);
    if (bVar6) {
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
      uVar1 = pNVar12->TypeID;
      pKVar10 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator->(&it);
      node = llvm::yaml::KeyValueNode::getValue(pKVar10);
      if (uVar1 != 4) {
        pcVar21 = "unexpected \'commands\' value (expected map)";
        pMStack_150 = (MappingNode *)0x2a;
        goto LAB_0013069c;
      }
      _version = llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)node);
      while( true ) {
        if (_version == (MappingNode *)0x0) break;
        pKVar10 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator*((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                             *)&version);
        pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
        if (pNVar12->TypeID == 1) {
          pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
          if (pNVar12->TypeID != 4) {
            pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
            pcVar21 = "invalid value type in \'commands\' map";
            pMStack_150 = (MappingNode *)0x24;
            goto LAB_0013187b;
          }
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                    (&name,pNVar12,scalar_14);
          pMVar13 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar10);
          Key_01.Length = name._M_string_length;
          Key_01.Data = name._M_dataplus._M_p;
          sVar19 = llvm::
                   StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                   ::count(&this->commands,Key_01);
          if (sVar19 == 0) {
            __begin3 = llvm::yaml::begin<llvm::yaml::MappingNode>(pMVar13);
            name_2._M_dataplus._M_p = (pointer)0x0;
            bVar6 = llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator==(&__begin3,
                               (basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                *)&name_2);
            if (bVar6) {
              pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
              pMStack_150 = (MappingNode *)0x2f;
              message_18.Length = 0x2f;
              message_18.Data = "missing \'tool\' key for command in \'command\' map";
              error(this,pNVar12,message_18);
            }
            else {
              pKVar10 = llvm::yaml::
                        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                        ::operator->(&__begin3);
              pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10);
              name_11.Length = (size_t)pMStack_150;
              name_11.Data = (char *)0x4;
              bVar6 = nodeIsScalarString(pBVar11,(Node *)0x1a3b86,name_11);
              pKVar10 = llvm::yaml::
                        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                        ::operator->(&__begin3);
              if (bVar6) {
                pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                if (pNVar12->TypeID == 1) {
                  pKVar10 = llvm::yaml::
                            basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                            ::operator->(&__begin3);
                  pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                  (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                            (&name_2,pNVar12,scalar_15);
                  name_00.Length = name_2._M_string_length;
                  name_00.Data = name_2._M_dataplus._M_p;
                  pKVar10 = llvm::yaml::
                            basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                            ::operator->(&__begin3);
                  pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                  pTVar14 = getOrCreateTool(this,name_00,pNVar12);
                  std::__cxx11::string::_M_dispose();
                  if (pTVar14 != (Tool *)0x0) {
                    pMStack_150 = (MappingNode *)name._M_string_length;
                    (*pTVar14->_vptr_Tool[5])(&__begin5,pTVar14,name._M_dataplus._M_p);
                    if (__begin5.Base == (MappingNode *)0x0) {
                      pKVar10 = llvm::yaml::
                                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                ::operator->(&__begin3);
                      pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                      pMStack_150 = (MappingNode *)0x1f;
                      message_29.Length = 0x1f;
                      message_29.Data = "tool failed to create a command";
                      error(this,pNVar12,message_29);
                      iVar9 = 1;
                    }
                    else {
                      do {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                llvm::yaml::
                                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                ::operator++(&__begin3);
                                if (__begin3.Base == (MappingNode *)0x0) {
                                  (*this->delegate->_vptr_BuildFileDelegate[0xb])
                                            (this->delegate,name._M_dataplus._M_p,
                                             name._M_string_length,__begin5.Base);
                                  Key_02.Length = name._M_string_length;
                                  Key_02.Data = name._M_dataplus._M_p;
                                  puVar20 = llvm::
                                            StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                                            ::operator[](&this->commands,Key_02);
                                  pMStack_150 = __begin5.Base;
                                  __begin5.Base = (MappingNode *)0x0;
                                  pCVar2 = (puVar20->_M_t).
                                           super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
                                           .
                                           super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>
                                           ._M_head_impl;
                                  (puVar20->_M_t).
                                  super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
                                  .super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>.
                                  _M_head_impl = (Command *)pMStack_150;
                                  iVar9 = 0;
                                  if (pCVar2 != (Command *)0x0) {
                                    (*(pCVar2->super_JobDescriptor)._vptr_JobDescriptor[1])();
                                  }
                                  goto LAB_001322c8;
                                }
                                pKVar10 = llvm::yaml::
                                          basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                          ::operator->(&__begin3);
                                pBVar11 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey(pKVar10)
                                ;
                                pKVar10 = llvm::yaml::
                                          basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                          ::operator->(&__begin3);
                                pSVar15 = (SequenceNode *)
                                          llvm::yaml::KeyValueNode::getValue(pKVar10);
                                name_12.Length = (size_t)pMStack_150;
                                name_12.Data = (char *)0x6;
                                bVar6 = nodeIsScalarString(pBVar11,(Node *)0x1ac2f6,name_12);
                                if (!bVar6) break;
                                if ((pSVar15->super_Node).TypeID == 5) {
                                  key._M_dataplus._M_p = (pointer)0x0;
                                  key._M_string_length = 0;
                                  key.field_2._M_allocated_capacity = 0;
                                  value._M_dataplus._M_p =
                                       (pointer)llvm::yaml::begin<llvm::yaml::SequenceNode>(pSVar15)
                                  ;
                                  while (value._M_dataplus._M_p != (pointer)0x0) {
                                    pNVar12 = llvm::yaml::
                                              basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                              ::operator*((
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&value);
                                    if (pNVar12->TypeID == 1) {
                                      (anonymous_namespace)::BuildFileImpl::
                                      stringFromScalarNode_abi_cxx11_(&name_2,pNVar12,scalar_16);
                                      name_01.Length = name_2._M_string_length;
                                      name_01.Data = name_2._M_dataplus._M_p;
                                      properties.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)getOrCreateNode(this,name_01,true);
                                      std::
                                      vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                                      ::emplace_back<llbuild::buildsystem::Node*>
                                                ((vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                                                  *)&key,(Node **)&properties);
                                      std::__cxx11::string::_M_dispose();
                                    }
                                    else {
                                      message_19.Length = 0x29;
                                      message_19.Data =
                                           "invalid node type in \'inputs\' command key";
                                      error(this,pNVar12,message_19);
                                    }
                                    llvm::yaml::
                                    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                    ::operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&value);
                                  }
                                  name_2.field_2._8_8_ =
                                       (pBVar11->mainFilename).field_2._M_allocated_capacity;
                                  pMStack_150 = (MappingNode *)
                                                (ulong)(uint)(*(int *)((long)&(pBVar11->mainFilename
                                                                              ).field_2 + 8) -
                                                             (int)name_2.field_2._8_8_);
                                  name_2._M_dataplus._M_p = (pointer)this->delegate;
                                  name_2._M_string_length =
                                       (size_type)(this->mainFilename)._M_dataplus._M_p;
                                  name_2.field_2._M_allocated_capacity =
                                       (this->mainFilename)._M_string_length;
                                  (*((__begin5.Base)->super_Node)._vptr_Node[8])
                                            (__begin5.Base,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&name_2,&key);
                                  std::
                                  _Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                  ::~_Vector_base((
                                                  _Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                                  *)&key);
                                }
                                else {
                                  pMStack_150 = (MappingNode *)0x2b;
                                  message_21.Length = 0x2b;
                                  message_21.Data = "invalid value type for \'inputs\' command key";
                                  error(this,(Node *)pSVar15,message_21);
                                }
                              }
                              name_13.Length = (size_t)pMStack_150;
                              name_13.Data = (char *)0x7;
                              bVar6 = nodeIsScalarString(pBVar11,(Node *)0x1ac30c,name_13);
                              if (!bVar6) break;
                              if ((pSVar15->super_Node).TypeID == 5) {
                                key._M_dataplus._M_p = (pointer)0x0;
                                key._M_string_length = 0;
                                key.field_2._M_allocated_capacity = 0;
                                value._M_dataplus._M_p =
                                     (pointer)llvm::yaml::begin<llvm::yaml::SequenceNode>(pSVar15);
                                while (value._M_dataplus._M_p != (pointer)0x0) {
                                  pNVar12 = llvm::yaml::
                                            basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                            ::operator*((
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&value);
                                  if (pNVar12->TypeID == 1) {
                                    (anonymous_namespace)::BuildFileImpl::
                                    stringFromScalarNode_abi_cxx11_(&name_2,pNVar12,scalar_17);
                                    name_02.Length = name_2._M_string_length;
                                    name_02.Data = name_2._M_dataplus._M_p;
                                    pNVar18 = getOrCreateNode(this,name_02,true);
                                    std::__cxx11::string::_M_dispose();
                                    name_2._M_dataplus._M_p = (pointer)pNVar18;
                                    std::
                                    vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                    ::push_back((vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                                 *)&key,(value_type *)&name_2);
                                    properties.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start =
                                         (pointer)__begin5.Base;
                                    std::
                                    vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
                                    ::emplace_back<llbuild::buildsystem::Command*>
                                              ((vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
                                                *)(name_2._M_dataplus._M_p + 0x28),
                                               (Command **)&properties);
                                  }
                                  else {
                                    message_20.Length = 0x2a;
                                    message_20.Data = "invalid node type in \'outputs\' command key"
                                    ;
                                    error(this,pNVar12,message_20);
                                  }
                                  llvm::yaml::
                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                  ::operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                *)&value);
                                }
                                name_2.field_2._8_8_ =
                                     (pBVar11->mainFilename).field_2._M_allocated_capacity;
                                pMStack_150 = (MappingNode *)
                                              (ulong)(uint)(*(int *)((long)&(pBVar11->mainFilename).
                                                                            field_2 + 8) -
                                                           (int)name_2.field_2._8_8_);
                                name_2._M_dataplus._M_p = (pointer)this->delegate;
                                name_2._M_string_length =
                                     (size_type)(this->mainFilename)._M_dataplus._M_p;
                                name_2.field_2._M_allocated_capacity =
                                     (this->mainFilename)._M_string_length;
                                (*((__begin5.Base)->super_Node)._vptr_Node[9])
                                          (__begin5.Base,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&name_2,&key);
                                std::
                                _Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                ::~_Vector_base((_Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                                 *)&key);
                              }
                              else {
                                pMStack_150 = (MappingNode *)0x2c;
                                message_22.Length = 0x2c;
                                message_22.Data = "invalid value type for \'outputs\' command key";
                                error(this,(Node *)pSVar15,message_22);
                              }
                            }
                            name_14.Length = (size_t)pMStack_150;
                            name_14.Data = (char *)0xb;
                            bVar6 = nodeIsScalarString(pBVar11,(Node *)0x1aaa33,name_14);
                            iVar3 = __begin5;
                            if (!bVar6) break;
                            if ((pSVar15->super_Node).TypeID == 1) {
                              name_2.field_2._8_8_ =
                                   (pBVar11->mainFilename).field_2._M_allocated_capacity;
                              name_2._M_dataplus._M_p = (pointer)this->delegate;
                              name_2._M_string_length =
                                   (size_type)(this->mainFilename)._M_dataplus._M_p;
                              name_2.field_2._M_allocated_capacity =
                                   (this->mainFilename)._M_string_length;
                              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                        (&key,pSVar15,
                                         (ScalarNode *)name_2.field_2._M_allocated_capacity);
                              pMStack_150 = (MappingNode *)key._M_string_length;
                              (*((iVar3.Base)->super_Node)._vptr_Node[7])
                                        (iVar3.Base,
                                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&name_2,key._M_dataplus._M_p);
                              std::__cxx11::string::_M_dispose();
                            }
                            else {
                              pMStack_150 = (MappingNode *)0x30;
                              message_23.Length = 0x30;
                              message_23.Data = "invalid value type for \'description\' command key"
                              ;
                              error(this,(Node *)pSVar15,message_23);
                            }
                          }
                          if (*(int *)&pBVar11->delegate == 1) break;
                          pMStack_150 = (MappingNode *)0x22;
                          message_24.Length = 0x22;
                          message_24.Data = "invalid key type in \'commands\' map";
                          error(this,(Node *)pBVar11,message_24);
                        }
                        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                  (&key,pBVar11,scalar_18);
                        pMStack_150 = (MappingNode *)key._M_string_length;
                        _Var4 = key._M_dataplus;
                        iVar3 = __begin5;
                        uVar1 = (pSVar15->super_Node).TypeID;
                        if (uVar1 == 1) {
                          name_2.field_2._8_8_ =
                               (pBVar11->mainFilename).field_2._M_allocated_capacity;
                          name_2._M_dataplus._M_p = (pointer)this->delegate;
                          name_2._M_string_length = (size_type)(this->mainFilename)._M_dataplus._M_p
                          ;
                          name_2.field_2._M_allocated_capacity =
                               (this->mainFilename)._M_string_length;
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    (&value,pSVar15,
                                     (ScalarNode *)name_2.field_2._M_allocated_capacity);
                          iVar9 = (*((iVar3.Base)->super_Node)._vptr_Node[10])
                                            (iVar3.Base,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&name_2,_Var4._M_p,pMStack_150,
                                             value._M_dataplus._M_p,value._M_string_length);
                          cVar8 = (char)iVar9;
                          std::__cxx11::string::_M_dispose();
LAB_00132163:
                          if (cVar8 == '\0') {
                            iVar9 = 1;
                            goto LAB_00132172;
                          }
                          iVar9 = 0;
                          bVar6 = true;
                        }
                        else {
                          if (uVar1 == 5) {
                            value._M_dataplus._M_p = (pointer)0x0;
                            value._M_string_length = 0;
                            value.field_2._M_allocated_capacity = 0;
                            properties.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)llvm::yaml::begin<llvm::yaml::SequenceNode>(pSVar15);
                            while (pMStack_150 = (MappingNode *)key._M_string_length,
                                  _Var4._M_p = key._M_dataplus._M_p, iVar3.Base = __begin5.Base,
                                  properties.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              pNVar12 = llvm::yaml::
                                        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                        ::operator*((
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&properties);
                              if (pNVar12->TypeID == 1) {
                                (anonymous_namespace)::BuildFileImpl::
                                stringFromScalarNode_abi_cxx11_(&name_2,pNVar12,scalar_21);
                                std::
                                vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                                emplace_back<std::__cxx11::string>
                                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                            *)&value,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&name_2);
                                std::__cxx11::string::_M_dispose();
                              }
                              else {
                                message_25.Length = 0x30;
                                message_25.Data =
                                     "invalid value type for command in \'commands\' map";
                                error(this,pNVar12,message_25);
                              }
                              llvm::yaml::
                              basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                              ::operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                            *)&properties);
                            }
                            name_2.field_2._8_8_ =
                                 (pBVar11->mainFilename).field_2._M_allocated_capacity;
                            name_2._M_dataplus._M_p = (pointer)this->delegate;
                            name_2._M_string_length =
                                 (size_type)(this->mainFilename)._M_dataplus._M_p;
                            name_2.field_2._M_allocated_capacity =
                                 (this->mainFilename)._M_string_length;
                            properties.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            properties.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            properties.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                            _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                      ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)
                                       &properties,value._M_dataplus._M_p,value._M_string_length);
                            iVar9 = (*((iVar3.Base)->super_Node)._vptr_Node[0xb])
                                              (iVar3.Base,
                                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&name_2,_Var4._M_p,pMStack_150,
                                               properties.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                               (long)properties.
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)properties.
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4);
                            cVar8 = (char)iVar9;
                            std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
                            ~_Vector_base((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                           *)&properties);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&value);
                            goto LAB_00132163;
                          }
                          if (uVar1 == 4) {
                            __begin2.Base = (MappingNode *)0x0;
                            __begin8 = llvm::yaml::begin<llvm::yaml::MappingNode>
                                                 ((MappingNode *)pSVar15);
                            while (pMStack_150 = (MappingNode *)key._M_string_length,
                                  _Var4._M_p = key._M_dataplus._M_p, iVar3.Base = __begin5.Base,
                                  __begin8.Base != (MappingNode *)0x0) {
                              pKVar10 = llvm::yaml::
                                        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                        ::operator*(&__begin8);
                              pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                              if (pNVar12->TypeID == 1) {
                                pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                                if (pNVar12->TypeID != 1) {
                                  pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                                  pcVar21 = "invalid value type for \'";
                                  goto LAB_00131e4b;
                                }
                                pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                                (anonymous_namespace)::BuildFileImpl::
                                stringFromScalarNode_abi_cxx11_(&value,pNVar12,scalar_19);
                                pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                                (anonymous_namespace)::BuildFileImpl::
                                stringFromScalarNode_abi_cxx11_
                                          ((string *)&properties,pNVar12,scalar_20);
                                std::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&name_2,&value,(string *)&properties);
                                std::
                                vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                          ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                            *)&__begin2,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&name_2);
                                std::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&name_2);
                              }
                              else {
                                pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                                pcVar21 = "invalid key type for \'";
LAB_00131e4b:
                                std::operator+(&value,pcVar21,&key);
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&name_2,&value,"\' in \'commands\' map");
                                message_01.Length = name_2._M_string_length;
                                message_01.Data = name_2._M_dataplus._M_p;
                                error(this,pNVar12,message_01);
                              }
                              std::__cxx11::string::_M_dispose();
                              std::__cxx11::string::_M_dispose();
                              llvm::yaml::
                              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                              ::operator++(&__begin8);
                            }
                            name_2.field_2._8_8_ =
                                 (pBVar11->mainFilename).field_2._M_allocated_capacity;
                            name_2._M_dataplus._M_p = (pointer)this->delegate;
                            name_2._M_string_length =
                                 (size_type)(this->mainFilename)._M_dataplus._M_p;
                            name_2.field_2._M_allocated_capacity =
                                 (this->mainFilename)._M_string_length;
                            value._M_dataplus._M_p = (pointer)0x0;
                            value._M_string_length = 0;
                            value.field_2._M_allocated_capacity = 0;
                            std::
                            vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                            ::
                            _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                                      ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                                        *)&value,__begin2.Base,0);
                            iVar9 = (*((iVar3.Base)->super_Node)._vptr_Node[0xc])
                                              (iVar3.Base,
                                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&name_2,_Var4._M_p,pMStack_150,
                                               value._M_dataplus._M_p,
                                               (long)(value._M_string_length -
                                                     (long)value._M_dataplus._M_p) >> 5);
                            cVar8 = (char)iVar9;
                            std::
                            _Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                            ::~_Vector_base((_Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                                             *)&value);
                            std::
                            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&__begin2);
                            goto LAB_00132163;
                          }
                          pMStack_150 = (MappingNode *)0x30;
                          message_26.Length = 0x30;
                          message_26.Data = "invalid value type for command in \'commands\' map";
                          error(this,(Node *)pSVar15,message_26);
                          iVar9 = 10;
LAB_00132172:
                          bVar6 = false;
                        }
                        std::__cxx11::string::_M_dispose();
                      } while (((bVar6) || (iVar9 == 0)) || (iVar9 == 10));
                    }
LAB_001322c8:
                    if (__begin5.Base != (MappingNode *)0x0) {
                      (*((__begin5.Base)->super_Node)._vptr_Node[1])();
                    }
                    std::__cxx11::string::_M_dispose();
                    if ((iVar9 != 3) && (iVar9 != 0)) {
                      return false;
                    }
                    goto LAB_00131881;
                  }
                  goto LAB_00130d65;
                }
                pKVar10 = llvm::yaml::
                          basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                          ::operator->(&__begin3);
                pNVar12 = llvm::yaml::KeyValueNode::getValue(pKVar10);
                pMStack_150 = (MappingNode *)0x37;
                message_28.Length = 0x37;
                message_28.Data = "invalid \'tool\' value type for command in \'commands\' map";
                error(this,pNVar12,message_28);
                while (__begin3.Base != (MappingNode *)0x0) {
                  llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator++(&__begin3);
                }
              }
              else {
                pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
                pMStack_150 = (MappingNode *)0x39;
                message_27.Length = 0x39;
                message_27.Data = "expected \'tool\' initial key for command in \'commands\' map";
                error(this,pNVar12,message_27);
                while (__begin3.Base != (MappingNode *)0x0) {
                  llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator++(&__begin3);
                }
              }
            }
            std::__cxx11::string::_M_dispose();
          }
          else {
            pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
            pMStack_150 = (MappingNode *)0x23;
            message_16.Length = 0x23;
            message_16.Data = "duplicate command in \'commands\' map";
            error(this,pNVar12,message_16);
            std::__cxx11::string::_M_dispose();
          }
        }
        else {
          pNVar12 = llvm::yaml::KeyValueNode::getKey(pKVar10);
          pcVar21 = "invalid key type in \'commands\' map";
          pMStack_150 = (MappingNode *)0x22;
LAB_0013187b:
          message_17.Length = (size_t)pMStack_150;
          message_17.Data = pcVar21;
          error(this,pNVar12,message_17);
        }
LAB_00131881:
        llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
        operator++((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> *)
                   &version);
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&it);
    }
    if (it.Base == (MappingNode *)0x0) {
      return true;
    }
    node = &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator*(&it)->super_Node;
    pcVar21 = "unexpected trailing top-level section";
    pMStack_150 = (MappingNode *)0x25;
  }
LAB_0013069c:
  message_03.Length = (size_t)pMStack_150;
  message_03.Data = pcVar21;
  error(this,node,message_03);
  return false;
LAB_001316eb:
  std::__cxx11::string::_M_dispose();
LAB_00130d65:
  std::__cxx11::string::_M_dispose();
  return false;
}

Assistant:

bool parseRootNode(llvm::yaml::Node* node) {
    // The root must always be a mapping.
    if (node->getType() != llvm::yaml::Node::NK_Mapping) {
      error(node, "unexpected top-level node");
      return false;
    }
    auto mapping = static_cast<llvm::yaml::MappingNode*>(node);

    // Iterate over each of the sections in the mapping.
    auto it = mapping->begin();
    if (!nodeIsScalarString(it->getKey(), "client")) {
      error(it->getKey(), "expected initial mapping key 'client'");
      return false;
    }
    if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
      error(it->getValue(), "unexpected 'client' value (expected map)");
      return false;
    }

    // Parse the client mapping.
    if (!parseClientMapping(
            static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
      return false;
    }
    ++it;

    // Parse the tools mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "tools")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'tools' value (expected map)");
        return false;
      }

      if (!parseToolsMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the targets mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "targets")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'targets' value (expected map)");
        return false;
      }

      if (!parseTargetsMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the default target, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "default")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(it->getValue(), "unexpected 'default' target value (expected scalar)");
        return false;
      }

      if (!parseDefaultTarget(
              static_cast<llvm::yaml::ScalarNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the nodes mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "nodes")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'nodes' value (expected map)");
        return false;
      }

      if (!parseNodesMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the commands mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "commands")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'commands' value (expected map)");
        return false;
      }

      if (!parseCommandsMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // There shouldn't be any trailing sections.
    if (it != mapping->end()) {
      error(&*it, "unexpected trailing top-level section");
      return false;
    }

    return true;
  }